

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O1

qsizetype __thiscall QByteArrayView::indexOf(QByteArrayView *this,char ch,qsizetype from)

{
  long lVar1;
  storage_type *psVar2;
  void *pvVar3;
  char *b;
  long lVar4;
  
  lVar1 = this->m_size;
  lVar4 = 0;
  if (0 < lVar1 + from) {
    lVar4 = lVar1 + from;
  }
  if (-1 < from) {
    lVar4 = from;
  }
  if (lVar1 - lVar4 != 0 && lVar4 <= lVar1) {
    psVar2 = this->m_data;
    pvVar3 = memchr(psVar2 + lVar4,(int)ch,lVar1 - lVar4);
    if (pvVar3 != (void *)0x0) {
      return (long)pvVar3 - (long)psVar2;
    }
  }
  return -1;
}

Assistant:

[[nodiscard]] qsizetype indexOf(char ch, qsizetype from = 0) const noexcept
    { return QtPrivate::findByteArray(*this, from, ch); }